

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Token * read_operator(Lexer *lexer,CharBuff *buff)

{
  char c;
  uint kind_00;
  uint pos;
  char *pcVar1;
  KindMeta KVar2;
  KindMeta kind;
  char *s;
  int op;
  int chr;
  CharBuff *buff_local;
  Lexer *lexer_local;
  
  kind_00 = read_chr(lexer);
  pos = read_chr(lexer);
  c = (char)kind_00;
  switch(pos) {
  case 0x26:
  case 0x2b:
  case 0x2d:
  case 0x2e:
  case 0x3d:
  case 0x3e:
  case 0x7c:
    append_chr(buff,c);
    append_chr(buff,(char)pos);
    pcVar1 = to_string(buff);
    KVar2 = find_kind(pcVar1);
    lexer_local = (Lexer *)new_token(lexer,KVar2.kind,pcVar1);
    break;
  default:
    unread_chr(lexer,pos);
    append_chr(buff,c);
    pcVar1 = to_string(buff);
    lexer_local = (Lexer *)new_token(lexer,kind_00,pcVar1);
    break;
  case 0x2a:
  case 0x2f:
    if (pos == 0x2f) {
      read_single_note(lexer,buff);
    }
    else {
      read_multi_note(lexer,buff);
    }
    append_chr(buff,c);
    pcVar1 = to_string(buff);
    lexer_local = (Lexer *)new_token(lexer,0xd1,pcVar1);
  }
  return (Token *)lexer_local;
}

Assistant:

Token *read_operator(Lexer* lexer, CharBuff* buff){
    int chr = read_chr(lexer);
    int op = read_chr(lexer);
    /**
     * ++  -- ....
     */
    switch (op) {
        case '.':
        case '+':
        case '-':
        case '&':
        case '|':
        case '>':
        case '=': {
            append_chr(buff, (char) chr);
            append_chr(buff, (char) op);
            char *s = to_string(buff);
            KindMeta kind = find_kind(s);
            return new_token(lexer, kind.kind, s);
        }
        case '/':
        case '*': {
            if (op == '/') {
                // single
                read_single_note(lexer, buff);
            } else {
                // multi
                read_multi_note(lexer,  buff);
            }
            break;
        }
        default: {
            unread_chr(lexer, op);
            append_chr(buff, (char )chr);
            return new_token(lexer, chr, to_string(buff));
        }
    }
    append_chr(buff, (char)chr);
    return new_token(lexer, EMPTY, to_string(buff));
}